

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flag_complex_edge_collapser.h
# Opt level: O1

bool __thiscall
Gudhi::collapse::Flag_complex_edge_collapser<int,double>::
is_dominated_by<boost::container::flat_set<int,std::less<int>,void>>
          (Flag_complex_edge_collapser<int,double> *this,flat_set<int,_std::less<int>,_void> *e_ngb,
          int c,double f)

{
  int *piVar1;
  long lVar2;
  ulong uVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  bool bVar7;
  
  uVar3 = (e_ngb->super_flat_tree<int,_boost::move_detail::identity<int>,_std::less<int>,_void>).
          m_data.m_seq.m_holder.m_size;
  if (uVar3 == 0) {
    __assert_fail("eni != ene",
                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Collapse/include/gudhi/Flag_complex_edge_collapser.h"
                  ,0xa5,
                  "bool Gudhi::collapse::Flag_complex_edge_collapser<int, double>::is_dominated_by(const Ngb &, Vertex, Filtration_value) [Vertex = int, Filtration_value = double, Ngb = boost::container::flat_set<int>]"
                 );
  }
  lVar2 = *(long *)(*(long *)this + 8 + (long)c * 0x18);
  if (lVar2 == 0) {
    __assert_fail("ci != ce",
                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Collapse/include/gudhi/Flag_complex_edge_collapser.h"
                  ,0xa6,
                  "bool Gudhi::collapse::Flag_complex_edge_collapser<int, double>::is_dominated_by(const Ngb &, Vertex, Filtration_value) [Vertex = int, Filtration_value = double, Ngb = boost::container::flat_set<int>]"
                 );
  }
  piVar5 = *(int **)(*(long *)this + (long)c * 0x18);
  piVar4 = piVar5 + lVar2 * 4;
  piVar6 = (e_ngb->super_flat_tree<int,_boost::move_detail::identity<int>,_std::less<int>,_void>).
           m_data.m_seq.m_holder.m_start;
  piVar1 = piVar6 + uVar3;
  do {
    if (piVar6 == (int *)0x0) {
      __assert_fail("!!m_ptr","/usr/include/boost/container/vector.hpp",0x8e,
                    "reference boost::container::vec_iterator<int *, true>::operator*() const [Pointer = int *, IsConst = true]"
                   );
    }
    do {
      if (*piVar6 <= *piVar5) {
        if ((*piVar5 <= *piVar6) && (*(double *)(piVar5 + 2) <= f)) {
          piVar6 = piVar6 + 1;
          if (piVar6 == piVar1) {
            uVar3 = 1;
            goto LAB_0010d62a;
          }
          piVar5 = piVar5 + 4;
          bVar7 = piVar5 != piVar4;
          uVar3 = (ulong)((byte)uVar3 & bVar7);
          goto LAB_0010d62d;
        }
        break;
      }
      piVar5 = piVar5 + 4;
    } while (piVar5 != piVar4);
    uVar3 = 0;
LAB_0010d62a:
    bVar7 = false;
LAB_0010d62d:
    if (!bVar7) {
      return SUB81(uVar3,0);
    }
  } while( true );
}

Assistant:

bool is_dominated_by(Ngb const& e_ngb, Vertex c, Filtration_value f){
    // The best strategy probably depends on the distribution, how sparse / dense the adjacency matrix is,
    // how (un)balanced the sizes of e_ngb and nc are.
    // Some efficient operations on sets work best with bitsets, although the need for a map complicates things.
#ifdef GUDHI_COLLAPSE_USE_DENSE_ARRAY
    for(auto v : e_ngb) {
      // if(v==c)continue;
      if(neighbors_dense(v,c) > f) return false;
    }
    return true;
#else
    auto&&nc = neighbors[c];
    // if few neighbors, use dichotomy? Seems slower.
    // I tried storing a copy of neighbors as a vector<absl::flat_hash_map> and using it for nc, but it was
    // a bit slower here. It did help with neighbors[dominator].find(w) in the main function though,
    // sometimes enough, sometimes not.
    auto ci = nc.begin();
    auto ce = nc.end();
    auto eni = e_ngb.begin();
    auto ene = e_ngb.end();
    assert(eni != ene);
    assert(ci != ce);
    // if(*eni == c && ++eni == ene) return true;
    for(;;){
      Vertex ve = *eni;
      Vertex vc = ci->first;
      while(ve > vc) {
        // try a gallop strategy (exponential search)? Seems slower
        if(++ci == ce) return false;
        vc = ci->first;
      }
      if(ve < vc) return false;
      // ve == vc
      if(ci->second > f) return false;
      if(++eni == ene)return true;
      // If we stored an open neighborhood of c (excluding c), we would need to test for c here and before the loop
      // if(*eni == c && ++eni == ene)return true;
      if(++ci == ce) return false;
    }
#endif
  }